

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cpp
# Opt level: O1

void __thiscall chatter::Peer::reset(Peer *this)

{
  list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
  *this_00;
  ProtocolChannel *pPVar1;
  int i;
  long lVar2;
  HostAddress local_20;
  
  lVar2 = 0;
  this->m_state = DISCONNECTED;
  HostAddress::HostAddress(&local_20);
  (this->m_address).m_port = local_20.m_port;
  (this->m_address).m_address = local_20.m_address;
  this->m_is_incoming_connection = false;
  this->m_connect_ts = 0;
  this->m_last_recv_ts = 0;
  this->m_last_ping_ts = 0;
  this->m_last_rtt_ts = 0;
  this->m_rtt_avg = 0;
  this->m_rtt_dev = 0;
  this->m_congestion_window = 3000;
  this->m_bytes_on_wire = 0;
  pPVar1 = this->m_channels;
  do {
    this_00 = &pPVar1->sent_reliable;
    std::__cxx11::
    _List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
    ::_M_clear(&this_00->
                super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
              );
    (pPVar1->sent_reliable).
    super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
    (pPVar1->sent_reliable).
    super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
    (pPVar1->sent_reliable).
    super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
    ._M_impl._M_node._M_size = 0;
    pPVar1->next_sequence = 0;
    pPVar1->id = (ProtocolChannelID)lVar2;
    lVar2 = lVar2 + 1;
    pPVar1 = pPVar1 + 1;
  } while (lVar2 != 0x21);
  return;
}

Assistant:

void Peer::reset()
{
    m_state = PeerState::DISCONNECTED;
    m_address = HostAddress();
    m_is_incoming_connection = false;
    m_connect_ts = 0;
    m_last_recv_ts = 0;
    m_last_ping_ts = 0;
    m_last_rtt_ts = 0;
    m_rtt_avg = 0;
    m_rtt_dev = 0;
    m_congestion_window = kMinCongestionWindow;
    m_bytes_on_wire = 0;

    for (int i = 0; i < 33; ++i) {
        m_channels[i].sent_reliable.clear();
        m_channels[i].next_sequence = 0;
        m_channels[i].id = i;
    }
}